

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O3

bool pstore::index::details::internal_node::validate_after_load
               (internal_node *internal,typed_address<pstore::index::details::internal_node> addr)

{
  ulong uVar1;
  signature_type sVar2;
  undefined1 uVar3;
  uint uVar4;
  long lVar5;
  internal_node *piVar6;
  
  if (*(long *)(internal->signature_)._M_elems != 0x6c616e7265746e49) {
    return false;
  }
  uVar4 = size(internal);
  if (3 < uVar4) {
    lVar5 = (ulong)(uVar4 >> 2) + 1;
    piVar6 = (internal_node *)internal[1].children_;
    do {
      if (((*(ulong *)&piVar6[0xffffffffffffffff].signature_ & 2) != 0) ||
         ((ulong)addr.a_.a_ <=
          (*(ulong *)&piVar6[0xffffffffffffffff].signature_ & 0xfffffffffffffffc))) {
        piVar6 = piVar6 + 0xffffffffffffffff;
LAB_00119dc8:
        return piVar6 == (internal_node *)(internal->children_ + uVar4);
      }
      uVar1 = *(ulong *)&((internal_node *)((long)(piVar6 + 0xffffffffffffffff) + 8))->signature_;
      if (((uVar1 & 2) != 0) || ((ulong)addr.a_.a_ <= (uVar1 & 0xfffffffffffffffc))) {
        piVar6 = (internal_node *)((long)(piVar6 + 0xffffffffffffffff) + 8);
        goto LAB_00119dc8;
      }
      if ((((ulong)((index_pointer *)((long)(piVar6 + 0xffffffffffffffff) + 0x10))->internal_ & 2)
           != 0) ||
         ((ulong)addr.a_.a_ <=
          ((ulong)((index_pointer *)((long)(piVar6 + 0xffffffffffffffff) + 0x10))->internal_ &
          0xfffffffffffffffc))) {
        piVar6 = (internal_node *)((long)(piVar6 + 0xffffffffffffffff) + 0x10);
        goto LAB_00119dc8;
      }
      sVar2._M_elems = *&(piVar6->signature_)._M_elems;
      if ((((ulong)sVar2._M_elems & 2) != 0) ||
         ((ulong)addr.a_.a_ <= ((ulong)sVar2._M_elems & 0xfffffffffffffffc))) goto LAB_00119dc8;
      lVar5 = lVar5 + -1;
      piVar6 = (internal_node *)((long)(piVar6 + 1) + 8);
    } while (1 < lVar5);
    uVar4 = uVar4 & 3;
  }
  uVar3 = (*(code *)(&DAT_0012735c + *(int *)(&DAT_0012735c + (ulong)uVar4 * 4)))();
  return (bool)uVar3;
}

Assistant:

bool internal_node::validate_after_load (internal_node const & internal,
                                                     typed_address<internal_node> const addr) {
#if PSTORE_SIGNATURE_CHECKS_ENABLED
                if (internal.signature_ != node_signature_) {
                    return false;
                }
#endif
                return std::all_of (std::begin (internal), std::end (internal),
                                    [addr] (index_pointer const & child) {
                                        if (child.is_heap () ||
                                            child.untag_address<internal_node> () >= addr) {
                                            return false;
                                        }
                                        return true;
                                    });
            }